

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void acvf2acf(double *acorr,int M)

{
  double dVar1;
  double var;
  int i;
  int M_local;
  double *acorr_local;
  
  dVar1 = *acorr;
  *acorr = 1.0;
  for (var._0_4_ = 1; var._0_4_ < M; var._0_4_ = var._0_4_ + 1) {
    acorr[var._0_4_] = acorr[var._0_4_] / dVar1;
  }
  return;
}

Assistant:

void acvf2acf(double *acorr, int M) {
	// Converts Autocovariance to autocorrelation function
	int i;
	double var;

	var = acorr[0];
	acorr[0] = 1.0;

	for (i = 1; i < M; i++) {
		acorr[i] = acorr[i] / var;
	}
}